

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O2

void __thiscall libDAI::RegionGraph::RecomputeOR(RegionGraph *this,size_t I)

{
  _Base_ptr p_Var1;
  size_type sVar2;
  mapped_type_conflict *pmVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  size_t local_30;
  
  local_30 = I;
  sVar2 = std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::count(&this->_fac2OR,&local_30);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->_fac2OR,&local_30);
    p_Var1 = (_Base_ptr)*pmVar3;
    TProb<double>::fill(&(this->_rg)._V1.
                         super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)p_Var1].super_Factor._p,1.0)
    ;
    for (p_Var4 = (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (p_Var4[1]._M_parent == p_Var1) {
        TFactor<double>::operator*=
                  (&(this->_rg)._V1.
                    super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)p_Var1].super_Factor,
                   (this->_fg)._fg._V2.
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var4 + 1));
      }
    }
  }
  return;
}

Assistant:

void RegionGraph::RecomputeOR( size_t I ) {
        if( _fac2OR.count(I) ) {
            size_t alpha = _fac2OR[I];
            OR(alpha).fill( 1.0 );
            for( fac2OR_cit I = _fac2OR.begin(); I != _fac2OR.end(); I++ )
                if( I->second == alpha )
                    OR(alpha) *= _fg.factor( I->first );
        }
    }